

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c++
# Opt level: O3

String * __thiscall kj::Url::toString(String *__return_storage_ptr__,Url *this,Context context)

{
  QueryParam *pQVar1;
  Fault FVar2;
  RemoveConst<char> *pRVar3;
  int iVar4;
  undefined1 *puVar5;
  String *pSVar6;
  String *pSVar7;
  String *pSVar8;
  size_t *extraout_RDX;
  size_t *extraout_RDX_00;
  String *pSVar9;
  String *extraout_RDX_01;
  String *extraout_RDX_02;
  String *extraout_RDX_03;
  String *extraout_RDX_04;
  kj *pkVar10;
  long lVar11;
  size_t *extraout_RDX_05;
  size_t *extraout_RDX_06;
  size_t *extraout_RDX_07;
  size_t *extraout_RDX_08;
  size_t *extraout_RDX_09;
  size_t *extraout_RDX_10;
  size_t *extraout_RDX_11;
  kj *pkVar12;
  size_t *extraout_RDX_12;
  size_t *extraout_RDX_13;
  size_t *extraout_RDX_14;
  size_t *extraout_RDX_15;
  size_t *extraout_RDX_16;
  kj *pkVar13;
  size_t *extraout_RDX_17;
  size_t *extraout_RDX_18;
  size_t *extraout_RDX_19;
  size_t *extraout_RDX_20;
  size_t *extraout_RDX_21;
  size_t *psVar14;
  size_t *extraout_RDX_22;
  size_t *extraout_RDX_23;
  size_t *extraout_RDX_24;
  undefined1 uVar15;
  String *newSize;
  kj *pkVar16;
  long lVar17;
  size_t sVar18;
  undefined1 *puVar19;
  char *pcVar20;
  ulong uVar21;
  size_t sVar22;
  Exception *pEVar23;
  char *pcVar24;
  kj *pkVar25;
  QueryParam *pQVar26;
  ArrayPtr<const_unsigned_char> bytes;
  ArrayPtr<const_unsigned_char> bytes_00;
  ArrayPtr<const_unsigned_char> bytes_01;
  ArrayPtr<const_unsigned_char> bytes_02;
  ArrayPtr<const_unsigned_char> bytes_03;
  ArrayPtr<const_unsigned_char> bytes_04;
  Vector<char> local_98;
  bool _kjCondition;
  Fault f;
  String *pSStack_60;
  ArrayDisposer *local_58;
  
  pSVar7 = pSStack_60;
  pSVar8 = (String *)0x0;
  local_98.builder.ptr =
       (char *)kj::_::HeapArrayDisposer::allocateImpl
                         (1,0,0x80,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_98.builder.endPtr =
       (char *)&(((String *)((long)local_98.builder.ptr + 0x78))->content).size_;
  local_98.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  psVar14 = extraout_RDX;
  local_98.builder.pos = local_98.builder.ptr;
  if (context != HTTP_REQUEST) {
    pcVar24 = (this->scheme).content.ptr;
    sVar18 = (this->scheme).content.size_;
    pcVar20 = pcVar24 + (sVar18 - 1);
    if (sVar18 == 0) {
      pcVar20 = (char *)0x0;
      pcVar24 = (char *)0x0;
    }
    uVar21 = (long)pcVar20 - (long)pcVar24;
    if (0x80 < uVar21) {
      sVar18 = 0x100;
      if (0x100 < uVar21) {
        sVar18 = uVar21;
      }
      Vector<char>::setCapacity(&local_98,sVar18);
    }
    pRVar3 = local_98.builder.pos;
    if (pcVar24 != pcVar20) {
      memcpy(local_98.builder.pos,pcVar24,uVar21);
      local_98.builder.pos = (RemoveConst<char> *)((long)pRVar3 + uVar21);
    }
    puVar5 = (undefined1 *)((long)local_98.builder.pos + (3 - (long)local_98.builder.ptr));
    pSVar8 = (String *)local_98.builder.ptr;
    psVar14 = (size_t *)local_98.builder.endPtr;
    if ((undefined1 *)((long)local_98.builder.endPtr - (long)local_98.builder.ptr) < puVar5) {
      puVar19 = (undefined1 *)0x4;
      if (local_98.builder.endPtr != local_98.builder.ptr) {
        puVar19 = (undefined1 *)(((long)local_98.builder.endPtr - (long)local_98.builder.ptr) * 2);
      }
      if (puVar19 < puVar5) {
        puVar19 = puVar5;
      }
      Vector<char>::setCapacity(&local_98,(size_t)puVar19);
      psVar14 = extraout_RDX_00;
    }
    *(undefined1 *)((long)&(((String *)local_98.builder.pos)->content).ptr + 2) = 0x2f;
    *(undefined2 *)&(((String *)local_98.builder.pos)->content).ptr = 0x2f3a;
    local_98.builder.pos =
         (RemoveConst<char> *)((long)&(((String *)local_98.builder.pos)->content).ptr + 3);
    if ((context == REMOTE_HREF) && ((this->userInfo).ptr.isSet == true)) {
      if ((this->options).percentDecode == true) {
        pkVar25 = (kj *)(this->userInfo).ptr.field_1.value.username.content.size_;
        pkVar16 = pkVar25;
        if (pkVar25 != (kj *)0x0) {
          pkVar16 = (kj *)(this->userInfo).ptr.field_1.value.username.content.ptr;
        }
        pkVar10 = (kj *)0x0;
        if (pkVar25 != (kj *)0x0) {
          pkVar10 = pkVar25 + -1;
        }
        bytes.size_ = (size_t)pSVar8;
        bytes.ptr = (uchar *)pkVar10;
        encodeUriUserInfo((String *)&f,pkVar16,bytes);
      }
      else {
        str<kj::String_const&>
                  ((String *)&f,(kj *)&(this->userInfo).ptr.field_1.value,(String *)psVar14);
      }
      pEVar23 = (Exception *)
                ((undefined1 *)((long)&f.exception[-1].details.builder.disposer + 7) +
                (long)pSStack_60);
      FVar2.exception = f.exception;
      if (pSStack_60 == (String *)0x0) {
        pEVar23 = (Exception *)0x0;
        FVar2.exception = (Exception *)0x0;
      }
      sVar22 = (long)pEVar23 - (long)FVar2.exception;
      pSVar6 = (String *)((long)local_98.builder.pos + (sVar22 - (long)local_98.builder.ptr));
      pSVar9 = (String *)((long)local_98.builder.endPtr - (long)local_98.builder.ptr);
      pSVar8 = (String *)local_98.builder.ptr;
      if (pSVar9 < pSVar6) {
        newSize = (String *)&DAT_00000004;
        if (local_98.builder.endPtr != local_98.builder.ptr) {
          newSize = (String *)((long)pSVar9 * 2);
        }
        if (newSize < pSVar6) {
          newSize = pSVar6;
        }
        Vector<char>::setCapacity(&local_98,(size_t)newSize);
        pSVar9 = extraout_RDX_01;
      }
      pRVar3 = local_98.builder.pos;
      if (FVar2.exception != pEVar23) {
        memcpy(local_98.builder.pos,FVar2.exception,sVar22);
        local_98.builder.pos = (RemoveConst<char> *)((long)pRVar3 + sVar22);
        pSVar9 = extraout_RDX_02;
      }
      FVar2.exception = f.exception;
      if (f.exception != (Exception *)0x0) {
        f.exception = (Exception *)0x0;
        pSStack_60 = (String *)0x0;
        (**local_58->_vptr_ArrayDisposer)(local_58,FVar2.exception,1,pSVar7,pSVar7,0);
        pSVar8 = pSVar7;
        pSVar9 = extraout_RDX_03;
      }
      pSVar7 = pSStack_60;
      if ((this->userInfo).ptr.field_1.value.password.ptr.isSet == true) {
        if (local_98.builder.pos == local_98.builder.endPtr) {
          pSVar8 = (String *)(((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2);
          pSVar9 = (String *)&DAT_00000004;
          if (local_98.builder.pos != local_98.builder.ptr) {
            pSVar9 = pSVar8;
          }
          Vector<char>::setCapacity(&local_98,(size_t)pSVar9);
          pSVar9 = extraout_RDX_04;
        }
        *(undefined1 *)&((Array<char> *)local_98.builder.pos)->ptr = 0x3a;
        local_98.builder.pos =
             (RemoveConst<char> *)((long)&((Array<char> *)local_98.builder.pos)->ptr + 1);
        if ((this->options).percentDecode == true) {
          pkVar25 = *(kj **)((long)&(this->userInfo).ptr.field_1 + 0x28);
          pkVar16 = pkVar25;
          if (pkVar25 != (kj *)0x0) {
            pkVar16 = *(kj **)((long)&(this->userInfo).ptr.field_1 + 0x20);
          }
          pkVar10 = (kj *)0x0;
          if (pkVar25 != (kj *)0x0) {
            pkVar10 = pkVar25 + -1;
          }
          bytes_00.size_ = (size_t)pSVar8;
          bytes_00.ptr = (uchar *)pkVar10;
          encodeUriUserInfo((String *)&f,pkVar16,bytes_00);
        }
        else {
          str<kj::String_const&>
                    ((String *)&f,
                     (kj *)&(this->userInfo).ptr.field_1.value.password.ptr.field_1.value,pSVar9);
        }
        pEVar23 = (Exception *)
                  ((undefined1 *)((long)&f.exception[-1].details.builder.disposer + 7) +
                  (long)pSStack_60);
        FVar2.exception = f.exception;
        if (pSStack_60 == (String *)0x0) {
          pEVar23 = (Exception *)0x0;
          FVar2.exception = (Exception *)0x0;
        }
        sVar22 = (long)pEVar23 - (long)FVar2.exception;
        puVar5 = (undefined1 *)((long)local_98.builder.pos + (sVar22 - (long)local_98.builder.ptr));
        if ((undefined1 *)((long)local_98.builder.endPtr - (long)local_98.builder.ptr) < puVar5) {
          puVar19 = (undefined1 *)0x4;
          if (local_98.builder.endPtr != local_98.builder.ptr) {
            puVar19 = (undefined1 *)
                      (((long)local_98.builder.endPtr - (long)local_98.builder.ptr) * 2);
          }
          if (puVar19 < puVar5) {
            puVar19 = puVar5;
          }
          Vector<char>::setCapacity(&local_98,(size_t)puVar19);
        }
        pRVar3 = local_98.builder.pos;
        if (FVar2.exception != pEVar23) {
          memcpy(local_98.builder.pos,FVar2.exception,sVar22);
          local_98.builder.pos = (RemoveConst<char> *)((long)pRVar3 + sVar22);
        }
        FVar2.exception = f.exception;
        if (f.exception != (Exception *)0x0) {
          f.exception = (Exception *)0x0;
          pSStack_60 = (String *)0x0;
          (**local_58->_vptr_ArrayDisposer)(local_58,FVar2.exception,1,pSVar7,pSVar7,0);
        }
      }
      if (local_98.builder.pos == local_98.builder.endPtr) {
        sVar18 = 4;
        if (local_98.builder.endPtr != local_98.builder.ptr) {
          sVar18 = ((long)local_98.builder.endPtr - (long)local_98.builder.ptr) * 2;
        }
        Vector<char>::setCapacity(&local_98,sVar18);
      }
      *(undefined1 *)&((Array<char> *)local_98.builder.pos)->ptr = 0x40;
      local_98.builder.pos =
           (RemoveConst<char> *)((long)&((Array<char> *)local_98.builder.pos)->ptr + 1);
    }
    pcVar20 = (this->host).content.ptr;
    sVar18 = (this->host).content.size_;
    pcVar24 = pcVar20;
    if (sVar18 == 0) {
      pcVar24 = (char *)0x0;
    }
    lVar11 = 0;
    if (sVar18 != 0) {
      lVar11 = sVar18 - 1;
    }
    if (sVar18 != 0 && sVar18 - 1 != 0) {
      lVar17 = 0;
      do {
        if ((*(ulong *)((anonymous_namespace)::HOST_CHARS + (ulong)((byte)pcVar24[lVar17] >> 6) * 8)
             >> ((ulong)(byte)pcVar24[lVar17] & 0x3f) & 1) == 0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39],kj::String_const&>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/url.c++"
                     ,0x1c5,FAILED,(char *)0x0,"\"invalid hostname when stringifying URL\", host",
                     (char (*) [39])"invalid hostname when stringifying URL",&this->host);
          puVar5 = (undefined1 *)((long)local_98.builder.pos + (0xc - (long)local_98.builder.ptr));
          if ((undefined1 *)((long)local_98.builder.endPtr - (long)local_98.builder.ptr) < puVar5) {
            puVar19 = (undefined1 *)0x4;
            if (local_98.builder.endPtr != local_98.builder.ptr) {
              puVar19 = (undefined1 *)
                        (((long)local_98.builder.endPtr - (long)local_98.builder.ptr) * 2);
            }
            if (puVar19 < puVar5) {
              puVar19 = puVar5;
            }
            Vector<char>::setCapacity(&local_98,(size_t)puVar19);
          }
          pSVar8 = (String *)0x2d64696c61766e69;
          (((String *)local_98.builder.pos)->content).ptr = (char *)0x2d64696c61766e69;
          *(undefined4 *)&(((String *)local_98.builder.pos)->content).size_ = 0x74736f68;
          local_98.builder.pos =
               (RemoveConst<char> *)((long)&(((String *)local_98.builder.pos)->content).size_ + 4);
          kj::_::Debug::Fault::~Fault(&f);
          psVar14 = extraout_RDX_07;
          goto LAB_00387bdf;
        }
        lVar17 = lVar17 + 1;
      } while (lVar11 != lVar17);
    }
    pcVar20 = pcVar20 + (sVar18 - 1);
    if (sVar18 == 0) {
      pcVar20 = (char *)0x0;
    }
    sVar22 = (long)pcVar20 - (long)pcVar24;
    puVar5 = (undefined1 *)((long)local_98.builder.pos + (sVar22 - (long)local_98.builder.ptr));
    pSVar8 = (String *)local_98.builder.ptr;
    psVar14 = (size_t *)local_98.builder.endPtr;
    if ((undefined1 *)((long)local_98.builder.endPtr - (long)local_98.builder.ptr) < puVar5) {
      puVar19 = (undefined1 *)0x4;
      if (local_98.builder.endPtr != local_98.builder.ptr) {
        puVar19 = (undefined1 *)(((long)local_98.builder.endPtr - (long)local_98.builder.ptr) * 2);
      }
      if (puVar19 < puVar5) {
        puVar19 = puVar5;
      }
      Vector<char>::setCapacity(&local_98,(size_t)puVar19);
      psVar14 = extraout_RDX_05;
    }
    pRVar3 = local_98.builder.pos;
    if (pcVar24 != pcVar20) {
      memcpy(local_98.builder.pos,pcVar24,sVar22);
      local_98.builder.pos = (RemoveConst<char> *)((long)pRVar3 + sVar22);
      psVar14 = extraout_RDX_06;
    }
  }
LAB_00387bdf:
  pkVar25 = (kj *)(this->path).builder.ptr;
  pkVar16 = (kj *)(this->path).builder.pos;
  if (pkVar25 != pkVar16) {
    do {
      pSVar7 = pSStack_60;
      uVar21 = *(ulong *)(pkVar25 + 8);
      sVar22 = uVar21 + (uVar21 == 0);
      if (uVar21 < 2) {
        pcVar20 = "";
        if (uVar21 != 0) {
          pcVar20 = *(char **)pkVar25;
        }
        iVar4 = bcmp(pcVar20,"",sVar22);
        psVar14 = extraout_RDX_08;
        if ((iVar4 != 0) || (((this->options).allowEmpty & 1U) != 0)) goto LAB_00387c42;
LAB_00388275:
        _kjCondition = false;
LAB_0038827a:
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,bool&,char_const(&)[25],kj::Vector<kj::String>const&>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/url.c++"
                   ,0x1cf,FAILED,
                   "(pathPart != \"\" || options.allowEmpty) && pathPart != \".\" && pathPart != \"..\""
                   ,"_kjCondition,\"invalid name in URL path\", path",&_kjCondition,
                   (char (*) [25])"invalid name in URL path",&this->path);
        kj::_::Debug::Fault::fatal(&f);
      }
LAB_00387c42:
      if (uVar21 == 3) {
        iVar4 = bcmp(*(void **)pkVar25,"..",sVar22);
        _kjCondition = iVar4 != 0;
        psVar14 = extraout_RDX_10;
        if (iVar4 == 0) goto LAB_0038827a;
      }
      else if ((uVar21 == 2) &&
              (iVar4 = bcmp(*(void **)pkVar25,".",sVar22), psVar14 = extraout_RDX_09, iVar4 == 0))
      goto LAB_00388275;
      if (local_98.builder.pos == local_98.builder.endPtr) {
        sVar18 = ((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2;
        if (local_98.builder.pos == local_98.builder.ptr) {
          sVar18 = 4;
        }
        pSVar8 = (String *)local_98.builder.ptr;
        Vector<char>::setCapacity(&local_98,sVar18);
        psVar14 = extraout_RDX_11;
      }
      *(undefined1 *)&((Array<char> *)local_98.builder.pos)->ptr = 0x2f;
      local_98.builder.pos =
           (RemoveConst<char> *)((long)&((Array<char> *)local_98.builder.pos)->ptr + 1);
      if ((this->options).percentDecode == true) {
        pkVar10 = *(kj **)(pkVar25 + 8);
        pkVar13 = pkVar10;
        if (pkVar10 != (kj *)0x0) {
          pkVar13 = *(kj **)pkVar25;
        }
        pkVar12 = pkVar10 + -1;
        if (pkVar10 == (kj *)0x0) {
          pkVar12 = (kj *)0x0;
        }
        bytes_01.size_ = (size_t)pSVar8;
        bytes_01.ptr = (uchar *)pkVar12;
        encodeUriPath((String *)&f,pkVar13,bytes_01);
      }
      else {
        str<kj::String_const&>((String *)&f,pkVar25,(String *)psVar14);
      }
      pEVar23 = (Exception *)
                ((undefined1 *)((long)&f.exception[-1].details.builder.disposer + 7) +
                (long)pSStack_60);
      FVar2.exception = f.exception;
      if (pSStack_60 == (String *)0x0) {
        pEVar23 = (Exception *)0x0;
        FVar2.exception = (Exception *)0x0;
      }
      sVar22 = (long)pEVar23 - (long)FVar2.exception;
      puVar5 = (undefined1 *)((long)local_98.builder.pos + (sVar22 - (long)local_98.builder.ptr));
      pSVar8 = (String *)local_98.builder.ptr;
      psVar14 = (size_t *)local_98.builder.endPtr;
      if ((undefined1 *)((long)local_98.builder.endPtr - (long)local_98.builder.ptr) < puVar5) {
        puVar19 = (undefined1 *)(((long)local_98.builder.endPtr - (long)local_98.builder.ptr) * 2);
        pSVar8 = (String *)&DAT_00000004;
        if (local_98.builder.endPtr == local_98.builder.ptr) {
          puVar19 = (undefined1 *)0x4;
        }
        if (puVar19 < puVar5) {
          puVar19 = puVar5;
        }
        Vector<char>::setCapacity(&local_98,(size_t)puVar19);
        psVar14 = extraout_RDX_12;
      }
      pRVar3 = local_98.builder.pos;
      if (FVar2.exception != pEVar23) {
        memcpy(local_98.builder.pos,FVar2.exception,sVar22);
        local_98.builder.pos = (RemoveConst<char> *)((long)pRVar3 + sVar22);
        psVar14 = extraout_RDX_13;
      }
      FVar2.exception = f.exception;
      if (f.exception != (Exception *)0x0) {
        f.exception = (Exception *)0x0;
        pSStack_60 = (String *)0x0;
        (**local_58->_vptr_ArrayDisposer)(local_58,FVar2.exception,1,pSVar7,pSVar7,0);
        pSVar8 = pSVar7;
        psVar14 = extraout_RDX_14;
      }
      pkVar25 = pkVar25 + 0x18;
    } while (pkVar25 != pkVar16);
  }
  if ((this->hasTrailingSlash != false) ||
     ((context == HTTP_REQUEST && ((this->path).builder.pos == (this->path).builder.ptr)))) {
    if (local_98.builder.pos == local_98.builder.endPtr) {
      sVar18 = 4;
      if (local_98.builder.pos != local_98.builder.ptr) {
        sVar18 = ((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2;
      }
      pSVar8 = (String *)local_98.builder.ptr;
      Vector<char>::setCapacity(&local_98,sVar18);
      psVar14 = extraout_RDX_15;
    }
    *(undefined1 *)&((Array<char> *)local_98.builder.pos)->ptr = 0x2f;
    local_98.builder.pos =
         (RemoveConst<char> *)((long)&((Array<char> *)local_98.builder.pos)->ptr + 1);
  }
  pQVar26 = (this->query).builder.ptr;
  pQVar1 = (this->query).builder.pos;
  if (pQVar26 != pQVar1) {
    uVar15 = 0x3f;
    pkVar25 = (kj *)&pQVar26->value;
    do {
      pSVar7 = pSStack_60;
      if (local_98.builder.pos == local_98.builder.endPtr) {
        sVar18 = ((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2;
        if (local_98.builder.pos == local_98.builder.ptr) {
          sVar18 = 4;
        }
        pSVar8 = (String *)local_98.builder.ptr;
        Vector<char>::setCapacity(&local_98,sVar18);
        psVar14 = extraout_RDX_16;
      }
      *(undefined1 *)&((Array<char> *)local_98.builder.pos)->ptr = uVar15;
      local_98.builder.pos =
           (RemoveConst<char> *)((long)&((Array<char> *)local_98.builder.pos)->ptr + 1);
      if ((this->options).percentDecode == true) {
        pkVar16 = *(kj **)(pkVar25 + -0x10);
        pkVar10 = pkVar16;
        if (pkVar16 != (kj *)0x0) {
          pkVar10 = *(kj **)(pkVar25 + -0x18);
        }
        pkVar13 = pkVar16 + -1;
        if (pkVar16 == (kj *)0x0) {
          pkVar13 = (kj *)0x0;
        }
        bytes_02.size_ = (size_t)pSVar8;
        bytes_02.ptr = (uchar *)pkVar13;
        encodeWwwForm((String *)&f,pkVar10,bytes_02);
      }
      else {
        str<kj::String_const&>((String *)&f,pkVar25 + -0x18,(String *)psVar14);
      }
      pEVar23 = (Exception *)
                ((undefined1 *)((long)&f.exception[-1].details.builder.disposer + 7) +
                (long)pSStack_60);
      FVar2.exception = f.exception;
      if (pSStack_60 == (String *)0x0) {
        pEVar23 = (Exception *)0x0;
        FVar2.exception = (Exception *)0x0;
      }
      sVar22 = (long)pEVar23 - (long)FVar2.exception;
      puVar5 = (undefined1 *)((long)local_98.builder.pos + (sVar22 - (long)local_98.builder.ptr));
      pSVar8 = (String *)local_98.builder.ptr;
      psVar14 = (size_t *)local_98.builder.endPtr;
      if ((undefined1 *)((long)local_98.builder.endPtr - (long)local_98.builder.ptr) < puVar5) {
        puVar19 = (undefined1 *)(((long)local_98.builder.endPtr - (long)local_98.builder.ptr) * 2);
        pSVar8 = (String *)&DAT_00000004;
        if (local_98.builder.endPtr == local_98.builder.ptr) {
          puVar19 = (undefined1 *)0x4;
        }
        if (puVar19 < puVar5) {
          puVar19 = puVar5;
        }
        Vector<char>::setCapacity(&local_98,(size_t)puVar19);
        psVar14 = extraout_RDX_17;
      }
      pRVar3 = local_98.builder.pos;
      if (FVar2.exception != pEVar23) {
        memcpy(local_98.builder.pos,FVar2.exception,sVar22);
        local_98.builder.pos = (RemoveConst<char> *)((long)pRVar3 + sVar22);
        psVar14 = extraout_RDX_18;
      }
      FVar2.exception = f.exception;
      if (f.exception != (Exception *)0x0) {
        f.exception = (Exception *)0x0;
        pSStack_60 = (String *)0x0;
        (**local_58->_vptr_ArrayDisposer)(local_58,FVar2.exception,1,pSVar7,pSVar7,0);
        pSVar8 = pSVar7;
        psVar14 = extraout_RDX_19;
      }
      pSVar7 = pSStack_60;
      if ((*(long *)(pkVar25 + 8) != 0) && (*(long *)pkVar25 != 0)) {
        if (local_98.builder.pos == local_98.builder.endPtr) {
          sVar18 = ((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2;
          if (local_98.builder.pos == local_98.builder.ptr) {
            sVar18 = 4;
          }
          pSVar8 = (String *)local_98.builder.ptr;
          Vector<char>::setCapacity(&local_98,sVar18);
          psVar14 = extraout_RDX_20;
        }
        *(undefined1 *)&((Array<char> *)local_98.builder.pos)->ptr = 0x3d;
        local_98.builder.pos =
             (RemoveConst<char> *)((long)&((Array<char> *)local_98.builder.pos)->ptr + 1);
        if ((this->options).percentDecode == true) {
          pkVar16 = *(kj **)(pkVar25 + 8);
          pkVar10 = pkVar16;
          if (pkVar16 != (kj *)0x0) {
            pkVar10 = *(kj **)pkVar25;
          }
          pkVar13 = (kj *)0x0;
          if (pkVar16 != (kj *)0x0) {
            pkVar13 = pkVar16 + -1;
          }
          bytes_03.size_ = (size_t)pSVar8;
          bytes_03.ptr = (uchar *)pkVar13;
          encodeWwwForm((String *)&f,pkVar10,bytes_03);
        }
        else {
          str<kj::String_const&>((String *)&f,pkVar25,(String *)psVar14);
        }
        pEVar23 = (Exception *)
                  ((undefined1 *)((long)&f.exception[-1].details.builder.disposer + 7) +
                  (long)pSStack_60);
        FVar2.exception = f.exception;
        if (pSStack_60 == (String *)0x0) {
          pEVar23 = (Exception *)0x0;
          FVar2.exception = (Exception *)0x0;
        }
        sVar22 = (long)pEVar23 - (long)FVar2.exception;
        puVar5 = (undefined1 *)((long)local_98.builder.pos + (sVar22 - (long)local_98.builder.ptr));
        pSVar8 = (String *)local_98.builder.ptr;
        psVar14 = (size_t *)local_98.builder.endPtr;
        if ((undefined1 *)((long)local_98.builder.endPtr - (long)local_98.builder.ptr) < puVar5) {
          puVar19 = (undefined1 *)(((long)local_98.builder.endPtr - (long)local_98.builder.ptr) * 2)
          ;
          pSVar8 = (String *)&DAT_00000004;
          if (local_98.builder.endPtr == local_98.builder.ptr) {
            puVar19 = (undefined1 *)0x4;
          }
          if (puVar19 < puVar5) {
            puVar19 = puVar5;
          }
          Vector<char>::setCapacity(&local_98,(size_t)puVar19);
          psVar14 = extraout_RDX_21;
        }
        pRVar3 = local_98.builder.pos;
        if (FVar2.exception != pEVar23) {
          memcpy(local_98.builder.pos,FVar2.exception,sVar22);
          local_98.builder.pos = (RemoveConst<char> *)((long)pRVar3 + sVar22);
          psVar14 = extraout_RDX_22;
        }
        FVar2.exception = f.exception;
        if (f.exception != (Exception *)0x0) {
          f.exception = (Exception *)0x0;
          pSStack_60 = (String *)0x0;
          (**local_58->_vptr_ArrayDisposer)(local_58,FVar2.exception,1,pSVar7,pSVar7);
          pSVar8 = pSVar7;
          psVar14 = extraout_RDX_23;
        }
      }
      pQVar26 = (QueryParam *)(pkVar25 + 0x18);
      uVar15 = 0x26;
      pkVar25 = pkVar25 + 0x30;
    } while (pQVar26 != pQVar1);
  }
  if ((context == REMOTE_HREF) && ((this->fragment).ptr.isSet == true)) {
    if (local_98.builder.pos == local_98.builder.endPtr) {
      sVar18 = 4;
      if (local_98.builder.pos != local_98.builder.ptr) {
        sVar18 = ((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2;
      }
      pSVar8 = (String *)local_98.builder.ptr;
      Vector<char>::setCapacity(&local_98,sVar18);
      psVar14 = extraout_RDX_24;
    }
    *(undefined1 *)&((Array<char> *)local_98.builder.pos)->ptr = 0x23;
    local_98.builder.pos =
         (RemoveConst<char> *)((long)&((Array<char> *)local_98.builder.pos)->ptr + 1);
    if ((this->options).percentDecode == true) {
      pkVar25 = (kj *)(this->fragment).ptr.field_1.value.content.size_;
      pkVar16 = pkVar25;
      if (pkVar25 != (kj *)0x0) {
        pkVar16 = (kj *)(this->fragment).ptr.field_1.value.content.ptr;
      }
      pkVar10 = (kj *)0x0;
      if (pkVar25 != (kj *)0x0) {
        pkVar10 = pkVar25 + -1;
      }
      bytes_04.size_ = (size_t)pSVar8;
      bytes_04.ptr = (uchar *)pkVar10;
      encodeUriFragment((String *)&f,pkVar16,bytes_04);
    }
    else {
      str<kj::String_const&>
                ((String *)&f,(kj *)&(this->fragment).ptr.field_1.value,(String *)psVar14);
    }
    pEVar23 = (Exception *)
              ((undefined1 *)((long)&f.exception[-1].details.builder.disposer + 7) +
              (long)pSStack_60);
    FVar2.exception = f.exception;
    if (pSStack_60 == (String *)0x0) {
      pEVar23 = (Exception *)0x0;
      FVar2.exception = (Exception *)0x0;
    }
    sVar22 = (long)pEVar23 - (long)FVar2.exception;
    puVar5 = (undefined1 *)((long)local_98.builder.pos + (sVar22 - (long)local_98.builder.ptr));
    if ((undefined1 *)((long)local_98.builder.endPtr - (long)local_98.builder.ptr) < puVar5) {
      puVar19 = (undefined1 *)0x4;
      if (local_98.builder.endPtr != local_98.builder.ptr) {
        puVar19 = (undefined1 *)(((long)local_98.builder.endPtr - (long)local_98.builder.ptr) * 2);
      }
      if (puVar19 < puVar5) {
        puVar19 = puVar5;
      }
      Vector<char>::setCapacity(&local_98,(size_t)puVar19);
    }
    pRVar3 = local_98.builder.pos;
    if (FVar2.exception != pEVar23) {
      memcpy(local_98.builder.pos,FVar2.exception,sVar22);
      local_98.builder.pos = (RemoveConst<char> *)((long)pRVar3 + sVar22);
    }
    FVar2.exception = f.exception;
    if (f.exception != (Exception *)0x0) {
      f.exception = (Exception *)0x0;
      (**local_58->_vptr_ArrayDisposer)(local_58,FVar2.exception,1,pSStack_60,pSStack_60,0);
    }
  }
  if (local_98.builder.pos == local_98.builder.endPtr) {
    sVar18 = 4;
    if (local_98.builder.pos != local_98.builder.ptr) {
      sVar18 = ((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2;
    }
    Vector<char>::setCapacity(&local_98,sVar18);
  }
  *(undefined1 *)&((Array<char> *)local_98.builder.pos)->ptr = 0;
  local_98.builder.pos =
       (RemoveConst<char> *)((long)&((Array<char> *)local_98.builder.pos)->ptr + 1);
  if (local_98.builder.pos != local_98.builder.endPtr) {
    Vector<char>::setCapacity(&local_98,(long)local_98.builder.pos - (long)local_98.builder.ptr);
  }
  (__return_storage_ptr__->content).ptr = local_98.builder.ptr;
  (__return_storage_ptr__->content).size_ = (long)local_98.builder.pos - (long)local_98.builder.ptr;
  (__return_storage_ptr__->content).disposer = local_98.builder.disposer;
  return __return_storage_ptr__;
}

Assistant:

String Url::toString(Context context) const {
  Vector<char> chars(128);

  if (context != HTTP_REQUEST) {
    chars.addAll(scheme);
    chars.addAll("://"_kj);

    if (context == REMOTE_HREF) {
      KJ_IF_SOME(user, userInfo) {
        chars.addAll(options.percentDecode ? encodeUriUserInfo(user.username)
                                          : kj::str(user.username));
        KJ_IF_SOME(pass, user.password) {
          chars.add(':');
          chars.addAll(options.percentDecode ? encodeUriUserInfo(pass) : kj::str(pass));
        }
        chars.add('@');
      }
    }

    // RFC3986 specifies that hosts can contain percent-encoding escapes while suggesting that
    // they should only be used for UTF-8 sequences. However, the DNS standard specifies a
    // different way to encode Unicode into domain names and doesn't permit any characters which
    // would need to be escaped. Meanwhile, encodeUriComponent() here would incorrectly try to
    // escape colons and brackets (e.g. around ipv6 literal addresses). So, instead, we throw if
    // the host is invalid.
    if (HOST_CHARS.containsAll(host)) {
      chars.addAll(host);
    } else {
      KJ_FAIL_REQUIRE("invalid hostname when stringifying URL", host) {
        chars.addAll("invalid-host"_kj);
        break;
      }
    }
  }

  for (auto& pathPart: path) {
    // Protect against path injection.
    KJ_REQUIRE((pathPart != "" || options.allowEmpty) && pathPart != "." && pathPart != "..",
               "invalid name in URL path", path) {
      continue;
    }
    chars.add('/');
    chars.addAll(options.percentDecode ? encodeUriPath(pathPart) : kj::str(pathPart));
  }
  if (hasTrailingSlash || (path.size() == 0 && context == HTTP_REQUEST)) {
    chars.add('/');
  }

  bool first = true;
  for (auto& param: query) {
    chars.add(first ? '?' : '&');
    first = false;
    chars.addAll(options.percentDecode ? encodeWwwForm(param.name) : kj::str(param.name));
    if (param.value.begin() != nullptr) {
      chars.add('=');
      chars.addAll(options.percentDecode ? encodeWwwForm(param.value) : kj::str(param.value));
    }
  }

  if (context == REMOTE_HREF) {
    KJ_IF_SOME(f, fragment) {
      chars.add('#');
      chars.addAll(options.percentDecode ? encodeUriFragment(f) : kj::str(f));
    }
  }

  chars.add('\0');
  return String(chars.releaseAsArray());
}